

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::StatisticsAccumulation::Merge
          (StatisticsAccumulation *this,int num_data,vector<double,_std::allocator<double>_> *first,
          SymmetricMatrix *second,Buffer *buffer)

{
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first2;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  double *pdVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  iterator iVar7;
  iterator iVar8;
  SymmetricMatrix *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  double c_1;
  int j_1;
  int i_1;
  double term2;
  double term1;
  int j;
  int i;
  double c;
  double mn;
  double mpn;
  double n;
  double m;
  double *delta;
  size_t length;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe08;
  Row *in_stack_fffffffffffffe10;
  anon_class_8_1_54a39803 in_stack_fffffffffffffe18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe38;
  int local_19c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  Row local_128;
  SymmetricMatrix local_110;
  Row local_c0;
  vector<double,_std::allocator<double>_> *local_a8;
  int local_a0;
  int local_9c;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  reference local_70;
  double *local_68;
  double *local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  size_type local_38;
  long local_30;
  SymmetricMatrix *local_28;
  int local_14;
  bool local_1;
  
  if ((((*(byte *)(in_RDI + 0x12) & 1) == 0) || (in_ESI < 1)) || (in_R8 == 0)) {
    local_1 = false;
  }
  else {
    local_38 = (size_type)(*(int *)(in_RDI + 8) + 1);
    local_30 = in_R8;
    local_28 = in_RCX;
    local_14 = in_ESI;
    if ((*(int *)(in_RDI + 0xc) < 1) ||
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX), sVar3 == local_38)) {
      if ((*(int *)(in_RDI + 0xc) < 2) ||
         (iVar2 = SymmetricMatrix::GetNumDimension(local_28), iVar2 == (int)local_38)) {
        if (*(int *)(local_30 + 8) == 0) {
          *(int *)(local_30 + 8) = local_14;
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffe20._M_current);
          if (!bVar1) {
            std::vector<double,_std::allocator<double>_>::operator=
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          }
          bVar1 = SymmetricMatrix::Empty(local_28);
          if (!bVar1) {
            SymmetricMatrix::operator=
                      ((SymmetricMatrix *)in_stack_fffffffffffffe20._M_current,
                       (SymmetricMatrix *)in_stack_fffffffffffffe18.c);
          }
          local_1 = true;
        }
        else {
          if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
            sVar3 = std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)(local_30 + 0x68));
            if (sVar3 != local_38) {
              std::vector<double,_std::allocator<double>_>::resize
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffffe30._M_current,
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
            }
            local_40 = (double *)
                       std::vector<double,_std::allocator<double>_>::begin
                                 (in_stack_fffffffffffffe08);
            local_48 = (double *)
                       std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe08);
            local_50 = (double *)
                       std::vector<double,_std::allocator<double>_>::begin
                                 (in_stack_fffffffffffffe08);
            local_58 = (double *)
                       std::vector<double,_std::allocator<double>_>::begin
                                 (in_stack_fffffffffffffe08);
            local_68 = (double *)
                       std::
                       transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::minus<double>>
                                 (local_40,local_48,local_50,local_58);
          }
          local_70 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_30 + 0x68),0);
          local_78 = (double)*(int *)(local_30 + 8);
          local_80 = (double)local_14;
          local_88 = local_78 + local_80;
          local_90 = local_78 * local_80;
          *(int *)(local_30 + 8) = local_14 + *(int *)(local_30 + 8);
          bVar1 = SymmetricMatrix::Empty(local_28);
          if (!bVar1) {
            if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
              for (local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish._4_4_ = 0;
                  local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish._4_4_ <= *(int *)(in_RDI + 8);
                  local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish._4_4_ =
                       local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish._4_4_ + 1) {
                in_stack_fffffffffffffe2c =
                     local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_;
                local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_ =
                     local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_;
                if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
                  local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_4_ = 0;
                  in_stack_fffffffffffffe2c =
                       (int)local_110.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                }
                for (; (int)local_110.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish <=
                       local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish._4_4_;
                    local_110.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish._0_4_ =
                         (int)local_110.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1) {
                  in_stack_fffffffffffffe18.c = (double)&local_110;
                  SymmetricMatrix::operator[]
                            ((SymmetricMatrix *)in_stack_fffffffffffffe18.c,
                             (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
                  iVar2 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
                  in_stack_fffffffffffffe20._M_current =
                       SymmetricMatrix::Row::operator[](in_stack_fffffffffffffe10,iVar2);
                  in_stack_fffffffffffffe10 =
                       (Row *)(((_Vector_base<double,_std::allocator<double>_> *)
                               &((SymmetricMatrix *)in_stack_fffffffffffffe20._M_current)->
                                _vptr_SymmetricMatrix)->_M_impl).super__Vector_impl_data._M_start;
                  SymmetricMatrix::operator[]
                            ((SymmetricMatrix *)in_stack_fffffffffffffe18.c,
                             (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
                  in_stack_fffffffffffffe08 =
                       (vector<double,_std::allocator<double>_> *)
                       SymmetricMatrix::Row::operator[](in_stack_fffffffffffffe10,iVar2);
                  (in_stack_fffffffffffffe08->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((double)in_stack_fffffffffffffe10 +
                                (double)(in_stack_fffffffffffffe08->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_start);
                  SymmetricMatrix::Row::~Row(&local_128);
                  SymmetricMatrix::Row::~Row((Row *)&local_110);
                }
              }
            }
            else {
              local_98 = local_90 / local_88;
              for (local_9c = 0; local_9c <= *(int *)(in_RDI + 8); local_9c = local_9c + 1) {
                if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
                  local_19c = 0;
                }
                else {
                  local_19c = local_9c;
                }
                for (local_a0 = local_19c; local_a0 <= local_9c; local_a0 = local_a0 + 1) {
                  SymmetricMatrix::operator[]
                            ((SymmetricMatrix *)in_stack_fffffffffffffe18.c,
                             (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
                  pdVar4 = SymmetricMatrix::Row::operator[]
                                     (in_stack_fffffffffffffe10,
                                      (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
                  in_stack_fffffffffffffe30._M_current = (double *)*pdVar4;
                  SymmetricMatrix::Row::~Row(&local_c0);
                  local_110.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)(local_98 * local_70[local_9c] * local_70[local_a0]);
                  in_stack_fffffffffffffe38._M_current =
                       (double *)
                       (in_stack_fffffffffffffe30._M_current +
                       (double)local_110.index_.
                               super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
                  local_a8 = (vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffe30._M_current;
                  SymmetricMatrix::operator[]
                            ((SymmetricMatrix *)in_stack_fffffffffffffe18.c,
                             (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
                  pdVar4 = SymmetricMatrix::Row::operator[]
                                     (in_stack_fffffffffffffe10,
                                      (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
                  *pdVar4 = (double)in_stack_fffffffffffffe38._M_current + *pdVar4;
                  SymmetricMatrix::Row::~Row
                            ((Row *)&local_110.data_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
                }
              }
            }
          }
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffe20._M_current);
          if (!bVar1) {
            if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
              cVar5 = std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe08)
              ;
              cVar6 = std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe08);
              iVar7 = std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe08)
              ;
              iVar8 = std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe08)
              ;
              std::
              transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
                        (cVar5._M_current,cVar6._M_current,iVar7._M_current,iVar8._M_current);
            }
            else {
              std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe08);
              std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe08);
              std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe08);
              std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe08);
              __first2._M_current._4_4_ = in_stack_fffffffffffffe2c;
              __first2._M_current._0_4_ = in_stack_fffffffffffffe28;
              std::
              transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::StatisticsAccumulation::Merge(int,std::vector<double,std::allocator<double>>const&,sptk::SymmetricMatrix_const&,sptk::StatisticsAccumulation::Buffer*)const::__0>
                        (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,__first2,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
            }
          }
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool StatisticsAccumulation::Merge(
    int num_data, const std::vector<double>& first,
    const SymmetricMatrix& second,
    StatisticsAccumulation::Buffer* buffer) const {
  if (!is_valid_ || num_data <= 0 || NULL == buffer) {
    return false;
  }

  const std::size_t length(num_order_ + 1);
  if (1 <= num_statistics_order_ && first.size() != length) {
    return false;
  }
  if (2 <= num_statistics_order_ &&
      second.GetNumDimension() != static_cast<int>(length)) {
    return false;
  }

  // Copy statistics if the buffer is empty.
  if (0 == buffer->zeroth_order_statistics_) {
    buffer->zeroth_order_statistics_ = num_data;
    if (!first.empty()) buffer->first_order_statistics_ = first;
    if (!second.Empty()) buffer->second_order_statistics_ = second;
    return true;
  }

  // Compute delta.
  if (numerically_stable_) {
    if (buffer->delta_.size() != length) {
      buffer->delta_.resize(length);
    }
    std::transform(buffer->first_order_statistics_.begin(),
                   buffer->first_order_statistics_.end(), first.begin(),
                   buffer->delta_.begin(), std::minus<double>());
  }
  const double* delta(&(buffer->delta_[0]));

  const double m(static_cast<double>(buffer->zeroth_order_statistics_));
  const double n(static_cast<double>(num_data));
  const double mpn(m + n);
  const double mn(m * n);
  buffer->zeroth_order_statistics_ += num_data;

  // Merge 2nd order statistics.
  if (!second.Empty()) {
    if (numerically_stable_) {
      const double c(mn / mpn);
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          const double term1(second[i][j]);
          const double term2(c * delta[i] * delta[j]);
          buffer->second_order_statistics_[i][j] += term1 + term2;
        }
      }
    } else {
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += second[i][j];
        }
      }
    }
  }

  // Merge 1st order statistics.
  if (!first.empty()) {
    if (numerically_stable_) {
      const double c(m / mpn);
      std::transform(buffer->delta_.begin(), buffer->delta_.end(),
                     first.begin(), buffer->first_order_statistics_.begin(),
                     [c](double x, double y) { return c * x + y; });
    } else {
      std::transform(
          first.begin(), first.end(), buffer->first_order_statistics_.begin(),
          buffer->first_order_statistics_.begin(), std::plus<double>());
    }
  }

  return true;
}